

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O1

void __thiscall Fluid::draw_particles(Fluid *this,mat4 *projection,mat4 *view,vec4 *viewport)

{
  PFNGLUNIFORM3FVPROC p_Var1;
  PFNGLUNIFORM4FVPROC p_Var2;
  PFNGLUNIFORMMATRIX4FVPROC p_Var3;
  GLint GVar4;
  socklen_t __len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  ulong uVar5;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  gfx::Program::use(&this->program);
  p_Var3 = glad_glUniformMatrix4fv;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"projection","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_50[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)projection);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var3 = glad_glUniformMatrix4fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"view","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_70[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Var2 = glad_glUniform4fv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"viewport","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_90[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)viewport);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var1 = glad_glUniform3fv;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"look","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_b0[0]);
  __fd = 1;
  (*p_Var1)(GVar4,1,(GLfloat *)&this->look);
  __addr = extraout_RDX;
  if (local_b0[0] != local_a0) {
    uVar5 = local_a0[0] + 1;
    operator_delete(local_b0[0],uVar5);
    __fd = (int)uVar5;
    __addr = extraout_RDX_00;
  }
  gfx::VAO::bind(&this->vao,__fd,__addr,__len);
  (*glad_glDrawArraysInstanced)(6,0,this->num_circle_vertices,(this->particle_ssbo)._length);
  gfx::VAO::unbind(&this->vao);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_particles(const glm::mat4& projection, const glm::mat4& view, const glm::vec4& viewport) {
        program.use();
        glUniformMatrix4fv(program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform4fv(program.uniform_loc("viewport"), 1, glm::value_ptr(viewport));
        glUniform3fv(program.uniform_loc("look"), 1, glm::value_ptr(look));
        vao.bind();
        glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());
        vao.unbind();
        program.disuse();
    }